

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::ImmutableMessageLiteGenerator
          (ImmutableMessageLiteGenerator *this,Descriptor *descriptor,Context *context)

{
  Descriptor *pDVar1;
  long lVar2;
  bool bVar3;
  ClassNameResolver *pCVar4;
  LogMessage *pLVar5;
  int i;
  long lVar6;
  long lVar7;
  LogFinisher local_69;
  LogMessage local_68;
  
  MessageGenerator::MessageGenerator(&this->super_MessageGenerator,descriptor);
  (this->super_MessageGenerator)._vptr_MessageGenerator =
       (_func_int **)&PTR__ImmutableMessageLiteGenerator_004d99e0;
  this->context_ = context;
  pCVar4 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar4;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
  FieldGeneratorMap(&this->field_generators_,descriptor,this->context_);
  if ((context->options_).enforce_lite == false) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_message_lite.cc"
               ,0x4a);
    pLVar5 = internal::LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: !HasDescriptorMethods(descriptor->file(), context->EnforceLite()): "
                       );
    pLVar5 = internal::LogMessage::operator<<
                       (pLVar5,
                        "Generator factory error: A lite message generator is used to generate non-lite messages."
                       );
    internal::LogFinisher::operator=(&local_69,pLVar5);
    internal::LogMessage::~LogMessage(&local_68);
  }
  lVar7 = 0;
  for (lVar6 = 0; pDVar1 = (this->super_MessageGenerator).descriptor_, lVar6 < *(int *)(pDVar1 + 4);
      lVar6 = lVar6 + 1) {
    bVar3 = IsRealOneof((FieldDescriptor *)(*(long *)(pDVar1 + 0x28) + lVar7));
    if (bVar3) {
      lVar2 = *(long *)((this->super_MessageGenerator).descriptor_ + 0x28);
      if ((*(byte *)(lVar2 + 1 + lVar7) & 0x10) == 0) {
        local_68.level_ = LOGLEVEL_INFO;
        local_68._4_4_ = 0;
      }
      else {
        local_68._0_8_ = *(undefined8 *)(lVar2 + 0x28 + lVar7);
      }
      std::
      _Rb_tree<google::protobuf::OneofDescriptor_const*,google::protobuf::OneofDescriptor_const*,std::_Identity<google::protobuf::OneofDescriptor_const*>,std::less<google::protobuf::OneofDescriptor_const*>,std::allocator<google::protobuf::OneofDescriptor_const*>>
      ::_M_insert_unique<google::protobuf::OneofDescriptor_const*>
                ((_Rb_tree<google::protobuf::OneofDescriptor_const*,google::protobuf::OneofDescriptor_const*,std::_Identity<google::protobuf::OneofDescriptor_const*>,std::less<google::protobuf::OneofDescriptor_const*>,std::allocator<google::protobuf::OneofDescriptor_const*>>
                  *)&(this->super_MessageGenerator).oneofs_,(OneofDescriptor **)&local_68);
    }
    lVar7 = lVar7 + 0x48;
  }
  return;
}

Assistant:

ImmutableMessageLiteGenerator::ImmutableMessageLiteGenerator(
    const Descriptor* descriptor, Context* context)
    : MessageGenerator(descriptor),
      context_(context),
      name_resolver_(context->GetNameResolver()),
      field_generators_(descriptor, context_) {
  GOOGLE_CHECK(!HasDescriptorMethods(descriptor->file(), context->EnforceLite()))
      << "Generator factory error: A lite message generator is used to "
         "generate non-lite messages.";
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (IsRealOneof(descriptor_->field(i))) {
      oneofs_.insert(descriptor_->field(i)->containing_oneof());
    }
  }
}